

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinPrimitiveEquals
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  Type TVar1;
  pointer pVVar2;
  int iVar3;
  HeapEntity *pHVar4;
  RuntimeError *pRVar5;
  bool bVar6;
  undefined1 auVar7 [12];
  stringstream ss;
  string local_1d0;
  undefined1 local_1b0 [392];
  
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 != 0x20) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"primitiveEquals takes 2 parameters, got ",0x28);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b0 + 0x10));
    pRVar5 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar5,&this->stack,loc,&local_1d0);
    __cxa_throw(pRVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  TVar1 = pVVar2->t;
  if (TVar1 == pVVar2[1].t) {
    if ((int)TVar1 < 2) {
      pHVar4 = (HeapEntity *)0x1;
      if (TVar1 == NULL_TYPE) goto LAB_00172851;
      if (TVar1 != BOOLEAN) goto LAB_00172961;
      bVar6 = (pVVar2->v).b == pVVar2[1].v.b;
    }
    else {
      if (TVar1 == NUMBER) {
        pHVar4 = (HeapEntity *)(ulong)(-(uint)(pVVar2[1].v.d == (pVVar2->v).d) & 1);
        goto LAB_00172851;
      }
      if (TVar1 != STRING) {
        if (TVar1 == FUNCTION) {
          pRVar5 = (RuntimeError *)__cxa_allocate_exception(0x38);
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"cannot test equality of functions","");
          Stack::makeError(pRVar5,&this->stack,loc,(string *)local_1b0);
          __cxa_throw(pRVar5,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
        }
LAB_00172961:
        auVar7 = __cxa_allocate_exception(0x38);
        (anonymous_namespace)::type_str_abi_cxx11_
                  (&local_1d0,
                   (_anonymous_namespace_ *)
                   (ulong)((args->
                           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                           )._M_impl.super__Vector_impl_data._M_start)->t,auVar7._8_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,"primitiveEquals operates on primitive types, got ",&local_1d0);
        Stack::makeError(auVar7._0_8_,&this->stack,loc,(string *)local_1b0);
        __cxa_throw(auVar7._0_8_,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      }
      iVar3 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)((pVVar2->v).h + 1),
                         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(pVVar2[1].v.h + 1));
      bVar6 = iVar3 == 0;
    }
    pHVar4 = (HeapEntity *)(ulong)bVar6;
  }
  else {
    pHVar4 = (HeapEntity *)0x0;
  }
LAB_00172851:
  (this->scratch).t = BOOLEAN;
  (this->scratch).v.h = pHVar4;
  return (AST *)0x0;
}

Assistant:

const AST *builtinPrimitiveEquals(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args.size() != 2) {
            std::stringstream ss;
            ss << "primitiveEquals takes 2 parameters, got " << args.size();
            throw makeError(loc, ss.str());
        }
        if (args[0].t != args[1].t) {
            scratch = makeBoolean(false);
            return nullptr;
        }
        bool r;
        switch (args[0].t) {
            case Value::BOOLEAN: r = args[0].v.b == args[1].v.b; break;

            case Value::NUMBER: r = args[0].v.d == args[1].v.d; break;

            case Value::STRING:
                r = static_cast<HeapString *>(args[0].v.h)->value ==
                    static_cast<HeapString *>(args[1].v.h)->value;
                break;

            case Value::NULL_TYPE: r = true; break;

            case Value::FUNCTION: throw makeError(loc, "cannot test equality of functions"); break;

            default:
                throw makeError(loc,
                                "primitiveEquals operates on primitive "
                                "types, got " +
                                    type_str(args[0]));
        }
        scratch = makeBoolean(r);
        return nullptr;
    }